

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseGlobalModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  undefined1 local_b8 [8];
  Location loc;
  ModuleFieldList export_fields;
  string name;
  ImportModuleField *local_40;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_38;
  _Head_base<0UL,_wabt::GlobalModuleField_*,_false> local_30;
  _Head_base<0UL,_wabt::GlobalImport_*,_false> local_28;
  
  RVar2 = Expect(this,Lpar);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation((Location *)local_b8,this);
  RVar2 = Expect(this,Global);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  export_fields.size_ = (size_t)&name._M_string_length;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  ParseBindVarOpt(this,(string *)&export_fields.size_);
  loc.field_1._8_8_ = 0;
  export_fields.first_ = (ModuleField *)0x0;
  export_fields.last_ = (ModuleField *)0x0;
  RVar2 = ParseInlineExports(this,(ModuleFieldList *)((long)&loc.field_1 + 8),Global);
  EVar3 = Error;
  if (RVar2.enum_ == Error) goto LAB_00da7907;
  bVar1 = PeekMatchLpar(this,Import);
  if (bVar1) {
    CheckImportOrdering(this,module);
    MakeUnique<wabt::GlobalImport,std::__cxx11::string&>
              ((wabt *)&local_28,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &export_fields.size_);
    RVar2 = ParseInlineImport(this,(Import *)local_28._M_head_impl);
    if ((RVar2.enum_ != Error) &&
       (RVar2 = ParseGlobalType(this,&(local_28._M_head_impl)->global), RVar2.enum_ != Error)) {
      GetLocation((Location *)((long)&name.field_2 + 8),this);
      MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::GlobalImport,std::default_delete<wabt::GlobalImport>>,wabt::Location>
                ((wabt *)&local_40,
                 (unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> *)
                 &local_28,(Location *)((long)&name.field_2 + 8));
      local_38._M_head_impl = local_40;
      local_40 = (ImportModuleField *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)&local_38);
      if (local_38._M_head_impl != (ImportModuleField *)0x0) {
        (*((local_38._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_38._M_head_impl = (ImportModuleField *)0x0;
      if (local_40 != (ImportModuleField *)0x0) {
        (*(local_40->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
          _vptr_ModuleField[1])();
      }
LAB_00da78c4:
      if (local_28._M_head_impl != (GlobalImport *)0x0) {
        (*((local_28._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)3>).super_Import.
          _vptr_Import[1])();
      }
      anon_unknown_1::AppendInlineExportFields
                (module,(ModuleFieldList *)((long)&loc.field_1 + 8),
                 (int)((ulong)((long)(module->globals).
                                     super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(module->globals).
                                    super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
      RVar2 = Expect(this,Rpar);
      EVar3 = (Enum)(RVar2.enum_ == Error);
      goto LAB_00da7907;
    }
  }
  else {
    MakeUnique<wabt::GlobalModuleField,wabt::Location&,std::__cxx11::string&>
              ((wabt *)(name.field_2._M_local_buf + 8),(Location *)local_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &export_fields.size_);
    RVar2 = ParseGlobalType(this,(Global *)(name.field_2._8_8_ + 0x40));
    local_28._M_head_impl = (GlobalImport *)name.field_2._8_8_;
    if ((RVar2.enum_ != Error) &&
       (RVar2 = ParseTerminatingInstrList(this,(ExprList *)(name.field_2._8_8_ + 0x68)),
       local_28._M_head_impl = (GlobalImport *)name.field_2._8_8_, RVar2.enum_ != Error)) {
      local_30._M_head_impl = (GlobalModuleField *)name.field_2._8_8_;
      name.field_2._8_8_ = 0;
      Module::AppendField(module,(unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                                  *)&local_30);
      if (local_30._M_head_impl != (GlobalModuleField *)0x0) {
        (*((local_30._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_30._M_head_impl = (GlobalModuleField *)0x0;
      local_28._M_head_impl = (GlobalImport *)name.field_2._8_8_;
      goto LAB_00da78c4;
    }
  }
  if (local_28._M_head_impl != (GlobalImport *)0x0) {
    (*((local_28._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)3>).super_Import._vptr_Import
      [1])();
  }
LAB_00da7907:
  intrusive_list<wabt::ModuleField>::clear
            ((intrusive_list<wabt::ModuleField> *)((long)&loc.field_1 + 8));
  std::__cxx11::string::~string((string *)&export_fields.size_);
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseGlobalModuleField(Module* module) {
  WABT_TRACE(ParseGlobalModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Global);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Global));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<GlobalImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseGlobalType(&import->global));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = MakeUnique<GlobalModuleField>(loc, name);
    CHECK_RESULT(ParseGlobalType(&field->global));
    CHECK_RESULT(ParseTerminatingInstrList(&field->global.init_expr));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->globals.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}